

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O2

compile_errcode __thiscall SwitchTable::Action(SwitchTable *this,SymbolType *parent_type)

{
  compile_errcode cVar1;
  int iVar2;
  
  iVar2 = 0;
  while( true ) {
    cVar1 = SwitchChildStatement::Action(&this->m_switch_child_statement,parent_type);
    if (cVar1 != 0) break;
    SwitchChildStatement::LogOutput(&this->m_switch_child_statement);
    iVar2 = iVar2 + -1;
  }
  return -(uint)(iVar2 == 0);
}

Assistant:

compile_errcode SwitchTable::Action(const SymbolType& parent_type) {
    int ret = 0;
    int count = 0;
    while (true) {
        if ((ret = m_switch_child_statement.Action(parent_type)) == COMPILE_OK) {
            m_switch_child_statement.LogOutput();
            count++;
        } else {
            break;
        }
    }
    if (count > 0)
        return COMPILE_OK;
    else
        return NOT_MATCH;
}